

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void resize_context_buffers(AV1_COMMON *cm,int width,int height)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  AV1_COMMON *in_RDI;
  int new_mi_cols;
  int new_mi_rows;
  
  if ((in_RDI->width != in_ESI) || (in_RDI->height != in_EDX)) {
    if (((in_RDI->mi_params).mi_cols < in_ESI + 3 >> 2) ||
       ((in_RDI->mi_params).mi_rows < in_EDX + 3 >> 2)) {
      iVar1 = av1_alloc_context_buffers(in_RDI,in_ESI,in_EDX,(BLOCK_SIZE)(in_EDX + 3 >> 0x1a));
      if (iVar1 != 0) {
        in_RDI->width = 0;
        in_RDI->height = 0;
        aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,"Failed to allocate context buffers");
      }
    }
    else {
      (*(in_RDI->mi_params).set_mb_mi)(&in_RDI->mi_params,in_ESI,in_EDX,BLOCK_4X4);
    }
    av1_init_mi_buffers((CommonModeInfoParams *)0x1af097);
    in_RDI->width = in_ESI;
    in_RDI->height = in_EDX;
  }
  ensure_mv_buffer(_new_mi_cols,in_RDI);
  in_RDI->cur_frame->width = in_RDI->width;
  in_RDI->cur_frame->height = in_RDI->height;
  return;
}

Assistant:

static inline void resize_context_buffers(AV1_COMMON *cm, int width,
                                          int height) {
#if CONFIG_SIZE_LIMIT
  if (width > DECODE_WIDTH_LIMIT || height > DECODE_HEIGHT_LIMIT)
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Dimensions of %dx%d beyond allowed size of %dx%d.",
                       width, height, DECODE_WIDTH_LIMIT, DECODE_HEIGHT_LIMIT);
#endif
  if (cm->width != width || cm->height != height) {
    const int new_mi_rows = CEIL_POWER_OF_TWO(height, MI_SIZE_LOG2);
    const int new_mi_cols = CEIL_POWER_OF_TWO(width, MI_SIZE_LOG2);

    // Allocations in av1_alloc_context_buffers() depend on individual
    // dimensions as well as the overall size.
    if (new_mi_cols > cm->mi_params.mi_cols ||
        new_mi_rows > cm->mi_params.mi_rows) {
      if (av1_alloc_context_buffers(cm, width, height, BLOCK_4X4)) {
        // The cm->mi_* values have been cleared and any existing context
        // buffers have been freed. Clear cm->width and cm->height to be
        // consistent and to force a realloc next time.
        cm->width = 0;
        cm->height = 0;
        aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate context buffers");
      }
    } else {
      cm->mi_params.set_mb_mi(&cm->mi_params, width, height, BLOCK_4X4);
    }
    av1_init_mi_buffers(&cm->mi_params);
    cm->width = width;
    cm->height = height;
  }

  ensure_mv_buffer(cm->cur_frame, cm);
  cm->cur_frame->width = cm->width;
  cm->cur_frame->height = cm->height;
}